

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_change.c
# Opt level: O1

int speed_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  void *pvVar1;
  SRC_STATE *pSVar2;
  code *pcVar3;
  int code;
  int error;
  int local_14;
  
  if (field == 1) {
    if (*value == '\x01') {
      pcVar3 = speed_segment_mix_bypass;
    }
    else {
      pcVar3 = speed_segment_mix;
    }
    segment->mix = pcVar3;
    return 1;
  }
  pvVar1 = segment->data;
  if (field == 0x27) {
    if (0.0 < *value) {
      *(double *)((long)pvVar1 + 0x18) = *value;
      return 1;
    }
    code = 8;
  }
  else {
    if (field == 4) {
      pSVar2 = src_new(*value,1,&local_14);
      if (pSVar2 == (SRC_STATE *)0x0) {
        mixed_err(0xf);
      }
      else {
        if (*(SRC_STATE **)((long)pvVar1 + 0x10) != (SRC_STATE *)0x0) {
          src_delete(*(SRC_STATE **)((long)pvVar1 + 0x10));
        }
        *(SRC_STATE **)((long)pvVar1 + 0x10) = pSVar2;
      }
      return (uint)(pSVar2 != (SRC_STATE *)0x0);
    }
    code = 7;
  }
  mixed_err(code);
  return 0;
}

Assistant:

int speed_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct speed_segment_data *data = (struct speed_segment_data *)segment->data;
  switch(field){
  case MIXED_RESAMPLE_TYPE: {
    int error;
    SRC_STATE *new = src_new(*(enum mixed_resample_type *)value, 1, &error);
    if(!new) {
      mixed_err(MIXED_RESAMPLE_FAILED);
      return 0;
    }
    if(data->resample_state)
      src_delete(data->resample_state);
    data->resample_state = new;
  }
    return 1;
  case MIXED_SPEED_FACTOR:
    if(*(double *)value <= 0.0){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->speed = *(double *)value;
    break;
  case MIXED_BYPASS:
    if(*(bool *)value){
      segment->mix = speed_segment_mix_bypass;
    }else{
      segment->mix = speed_segment_mix;
    }
    break;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
  return 1;
}